

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

AssertionResult __thiscall
testing::internal::EqFailure
          (internal *this,char *expected_expression,char *actual_expression,String *expected_value,
          String *actual_value,bool ignoring_case)

{
  char cVar1;
  bool bVar2;
  size_t sVar3;
  AssertionResult *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar4
  ;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar5;
  ostream *poVar6;
  char *pcVar7;
  undefined3 in_register_00000089;
  size_t sVar8;
  AssertionResult AVar9;
  AssertionResult local_60;
  char *local_50;
  undefined4 local_44;
  String *local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  Message msg;
  
  local_44 = CONCAT31(in_register_00000089,ignoring_case);
  local_50 = expected_expression;
  local_40 = expected_value;
  Message::Message((Message *)&local_38);
  poVar6 = (ostream *)(local_38.ptr_ + 0x10);
  if (local_38.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar6 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Value of: ",10);
  if (actual_expression == (char *)0x0) {
    sVar5.ptr_ = local_38.ptr_ + 0x10;
    sVar3 = 6;
    pcVar7 = "(null)";
  }
  else {
    sVar5.ptr_ = local_38.ptr_;
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar5.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_38.ptr_ + 0x10);
    }
    sVar3 = strlen(actual_expression);
    pcVar7 = actual_expression;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar5.ptr_,pcVar7,sVar3);
  bVar2 = String::operator==(actual_value,actual_expression);
  if (!bVar2) {
    poVar6 = (ostream *)(local_38.ptr_ + 0x10);
    if (local_38.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n  Actual: ",0xb);
    poVar6 = (ostream *)(local_38.ptr_ + 0x10);
    if (local_38.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    pcVar7 = actual_value->c_str_;
    if (pcVar7 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(null)",6);
    }
    else if (actual_value->length_ != 0) {
      sVar8 = 0;
      do {
        cVar1 = pcVar7[sVar8];
        if (cVar1 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\\0",2);
        }
        else {
          local_60.success_ = (bool)cVar1;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_60.success_,1);
        }
        sVar8 = sVar8 + 1;
      } while (sVar8 != actual_value->length_);
    }
  }
  poVar6 = (ostream *)(local_38.ptr_ + 0x10);
  if (local_38.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar6 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\nExpected: ",0xb);
  pcVar7 = local_50;
  if (local_50 == (char *)0x0) {
    sVar5.ptr_ = local_38.ptr_ + 0x10;
    sVar3 = 6;
    pcVar7 = "(null)";
  }
  else {
    sVar5.ptr_ = local_38.ptr_;
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar5.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_38.ptr_ + 0x10);
    }
    sVar3 = strlen(local_50);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar5.ptr_,pcVar7,sVar3);
  if ((char)local_44 != '\0') {
    poVar6 = (ostream *)(local_38.ptr_ + 0x10);
    if (local_38.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," (ignoring case)",0x10);
  }
  bVar2 = String::operator==(local_40,local_50);
  if (!bVar2) {
    poVar6 = (ostream *)(local_38.ptr_ + 0x10);
    if (local_38.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\nWhich is: ",0xb);
    poVar6 = (ostream *)(local_38.ptr_ + 0x10);
    if (local_38.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    pcVar7 = local_40->c_str_;
    if (pcVar7 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(null)",6);
    }
    else if (local_40->length_ != 0) {
      sVar8 = 0;
      do {
        cVar1 = pcVar7[sVar8];
        if (cVar1 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\\0",2);
        }
        else {
          local_60.success_ = (bool)cVar1;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_60.success_,1);
        }
        sVar8 = sVar8 + 1;
      } while (sVar8 != local_40->length_);
    }
  }
  local_60.success_ = false;
  local_60.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  other = AssertionResult::operator<<(&local_60,(Message *)&local_38);
  AssertionResult::AssertionResult((AssertionResult *)this,other);
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  sVar4.ptr_ = extraout_RDX;
  if (local_38.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_38.ptr_ + 8))();
    sVar4.ptr_ = extraout_RDX_00;
  }
  AVar9.message_.ptr_ = sVar4.ptr_;
  AVar9._0_8_ = this;
  return AVar9;
}

Assistant:

AssertionResult EqFailure(const char* expected_expression,
                          const char* actual_expression,
                          const String& expected_value,
                          const String& actual_value,
                          bool ignoring_case) {
  Message msg;
  msg << "Value of: " << actual_expression;
  if (actual_value != actual_expression) {
    msg << "\n  Actual: " << actual_value;
  }

  msg << "\nExpected: " << expected_expression;
  if (ignoring_case) {
    msg << " (ignoring case)";
  }
  if (expected_value != expected_expression) {
    msg << "\nWhich is: " << expected_value;
  }

  return AssertionFailure() << msg;
}